

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3Fts3ReadBlock(Fts3Table *p,sqlite3_int64 iBlockid,char **paBlob,int *pnBlob,int *pnLoad)

{
  sqlite3_blob **ppBlob;
  char *pcVar1;
  sqlite3_blob *psVar2;
  int iVar3;
  int iVar4;
  Incrblob *p_1;
  char *pcVar5;
  
  ppBlob = &p->pSegments;
  if (p->pSegments == (sqlite3_blob *)0x0) {
    if (p->zSegmentsTbl == (char *)0x0) {
      pcVar5 = sqlite3_mprintf("%s_segments",p->zName);
      p->zSegmentsTbl = pcVar5;
      if (pcVar5 == (char *)0x0) {
        return 7;
      }
    }
    iVar3 = sqlite3_blob_open(p->db,p->zDb,p->zSegmentsTbl,"block",iBlockid,0,ppBlob);
  }
  else {
    iVar3 = sqlite3_blob_reopen(p->pSegments,iBlockid);
  }
  if (iVar3 != 0) {
    return iVar3;
  }
  psVar2 = *ppBlob;
  iVar3 = 0;
  if ((psVar2 != (sqlite3_blob *)0x0) && (iVar3 = 0, *(long *)(psVar2 + 0x18) != 0)) {
    iVar3 = *(int *)psVar2;
  }
  *pnBlob = iVar3;
  if (paBlob == (char **)0x0) {
    return 0;
  }
  pcVar5 = (char *)sqlite3_malloc(iVar3 + 0x14);
  if (pcVar5 == (char *)0x0) {
    iVar4 = 7;
  }
  else {
    iVar4 = blobReadWrite(*ppBlob,pcVar5,iVar3,0,sqlite3BtreePayloadChecked);
    pcVar1 = pcVar5 + iVar3;
    pcVar1[0] = '\0';
    pcVar1[1] = '\0';
    pcVar1[2] = '\0';
    pcVar1[3] = '\0';
    pcVar1[4] = '\0';
    pcVar1[5] = '\0';
    pcVar1[6] = '\0';
    pcVar1[7] = '\0';
    pcVar1[8] = '\0';
    pcVar1[9] = '\0';
    pcVar1[10] = '\0';
    pcVar1[0xb] = '\0';
    pcVar1[0xc] = '\0';
    pcVar1[0xd] = '\0';
    pcVar1[0xe] = '\0';
    pcVar1[0xf] = '\0';
    pcVar1 = pcVar5 + (long)iVar3 + 0x10;
    pcVar1[0] = '\0';
    pcVar1[1] = '\0';
    pcVar1[2] = '\0';
    pcVar1[3] = '\0';
    if (iVar4 == 0) {
      iVar4 = 0;
      goto LAB_001ca47e;
    }
    sqlite3_free(pcVar5);
  }
  pcVar5 = (char *)0x0;
LAB_001ca47e:
  *paBlob = pcVar5;
  return iVar4;
}

Assistant:

SQLITE_PRIVATE int sqlite3Fts3ReadBlock(
  Fts3Table *p,                   /* FTS3 table handle */
  sqlite3_int64 iBlockid,         /* Access the row with blockid=$iBlockid */
  char **paBlob,                  /* OUT: Blob data in malloc'd buffer */
  int *pnBlob,                    /* OUT: Size of blob data */
  int *pnLoad                     /* OUT: Bytes actually loaded */
){
  int rc;                         /* Return code */

  /* pnBlob must be non-NULL. paBlob may be NULL or non-NULL. */
  assert( pnBlob );

  if( p->pSegments ){
    rc = sqlite3_blob_reopen(p->pSegments, iBlockid);
  }else{
    if( 0==p->zSegmentsTbl ){
      p->zSegmentsTbl = sqlite3_mprintf("%s_segments", p->zName);
      if( 0==p->zSegmentsTbl ) return SQLITE_NOMEM;
    }
    rc = sqlite3_blob_open(
       p->db, p->zDb, p->zSegmentsTbl, "block", iBlockid, 0, &p->pSegments
    );
  }

  if( rc==SQLITE_OK ){
    int nByte = sqlite3_blob_bytes(p->pSegments);
    *pnBlob = nByte;
    if( paBlob ){
      char *aByte = sqlite3_malloc(nByte + FTS3_NODE_PADDING);
      if( !aByte ){
        rc = SQLITE_NOMEM;
      }else{
        if( pnLoad && nByte>(FTS3_NODE_CHUNK_THRESHOLD) ){
          nByte = FTS3_NODE_CHUNKSIZE;
          *pnLoad = nByte;
        }
        rc = sqlite3_blob_read(p->pSegments, aByte, nByte, 0);
        memset(&aByte[nByte], 0, FTS3_NODE_PADDING);
        if( rc!=SQLITE_OK ){
          sqlite3_free(aByte);
          aByte = 0;
        }
      }
      *paBlob = aByte;
    }
  }

  return rc;
}